

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Histogram
               (Image *image,uint32_t x,uint32_t y,Image *mask,uint32_t maskX,uint32_t maskY,
               uint32_t width,uint32_t height,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *histogram)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uchar *puVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  reference pvVar7;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  int in_R9D;
  uint in_stack_00000008;
  int in_stack_00000010;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000018;
  uint8_t *imageXEnd;
  uint8_t *imageXMask;
  uint8_t *imageX;
  uint8_t *imageYEnd;
  uint8_t *imageYMask;
  uint8_t *imageY;
  uint32_t rowSizeMask;
  uint32_t rowSize;
  uint uVar8;
  undefined4 in_stack_fffffffffffffefc;
  int iVar9;
  undefined4 in_stack_ffffffffffffff04;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff08;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 *__new_size;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff20;
  ImageTemplate<unsigned_char> *this;
  undefined8 in_stack_ffffffffffffff28;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff30;
  uchar *local_c8;
  uint32_t in_stack_ffffffffffffff40;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff48;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff50;
  uint32_t *in_stack_ffffffffffffff58;
  byte *pbVar10;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined1 local_80 [96];
  int local_20;
  uint local_1c;
  ImageTemplate<unsigned_char> *local_18;
  int local_10;
  uint local_c;
  ImageTemplate<unsigned_char> *local_8;
  
  uVar8 = in_stack_00000008;
  iVar9 = in_stack_00000010;
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff30,(uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff18,in_stack_ffffffffffffff40,
             (uint32_t)in_stack_ffffffffffffff48);
  this = local_8;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff04,iVar9),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffefc,uVar8));
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff04,iVar9),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffefc,uVar8));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x11c17d);
  __new_size = local_80;
  __first._M_current = (uint *)local_8;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff04,iVar9),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffefc,uVar8));
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            ((uint32_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x11c1d2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,(size_type)__new_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffefc,uVar8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffefc,uVar8));
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
            (__first,in_stack_ffffffffffffff08,(uint *)CONCAT44(in_stack_ffffffffffffff04,iVar9));
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_8);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_18);
  puVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::data(local_8);
  pbVar4 = puVar3 + (ulong)local_c + (ulong)(local_10 * uVar1);
  local_c8 = PenguinV_Image::ImageTemplate<unsigned_char>::data(local_18);
  local_c8 = local_c8 + (ulong)local_1c + (ulong)(local_20 * uVar2);
  pbVar5 = pbVar4 + in_stack_00000010 * uVar1;
  while (pbVar4 != pbVar5) {
    pbVar6 = pbVar4 + in_stack_00000008;
    puVar3 = local_c8;
    pbVar10 = pbVar4;
    for (; pbVar4 != pbVar6; pbVar4 = pbVar4 + 1) {
      if (*local_c8 != '\0') {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (in_stack_00000018,(ulong)*pbVar4);
        *pvVar7 = *pvVar7 + 1;
      }
      local_c8 = local_c8 + 1;
    }
    local_c8 = puVar3 + uVar2;
    pbVar4 = pbVar10 + uVar1;
  }
  return;
}

Assistant:

void Histogram( const Image & image, uint32_t x, uint32_t y, const Image & mask, uint32_t maskX, uint32_t maskY, uint32_t width, uint32_t height,
                    std::vector < uint32_t > & histogram )
    {
        ParameterValidation( image, x, y, mask, maskX, maskY, width, height );
        VerifyGrayScaleImage( image, mask );
        OptimiseRoi( width, height, image, mask );

        histogram.resize( 256u );
        std::fill( histogram.begin(), histogram.end(), 0u );

        const uint32_t rowSize     = image.rowSize();
        const uint32_t rowSizeMask = mask.rowSize();

        const uint8_t * imageY     = image.data() + y * rowSize + x;
        const uint8_t * imageYMask = mask.data() + maskY * rowSizeMask + maskX;
        const uint8_t * imageYEnd  = imageY + height * rowSize;

        for( ; imageY != imageYEnd; imageY += rowSize, imageYMask += rowSizeMask ) {
            const uint8_t * imageX     = imageY;
            const uint8_t * imageXMask = imageYMask;
            const uint8_t * imageXEnd  = imageX + width;

            for( ; imageX != imageXEnd; ++imageX, ++imageXMask ) {
                if( (*imageXMask) > 0 )
                    ++histogram[*imageX];
            }
        }
    }